

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_macro_info.cpp
# Opt level: O2

string * __thiscall
duckdb::CreateMacroInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,CreateMacroInfo *this)

{
  pointer puVar1;
  pointer pMVar2;
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *function;
  pointer this_00;
  string local_b0;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar1 = (this->macros).
           super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->macros).
                 super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1; this_00 = this_00 + 1
      ) {
    if (__return_storage_ptr__->_M_string_length != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    pMVar2 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
             operator->(this_00);
    (*pMVar2->_vptr_MacroFunction[3])(&prefix,pMVar2);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&prefix);
  }
  ::std::__cxx11::string::string((string *)&prefix,"CREATE MACRO ",(allocator *)&local_b0);
  if ((this->super_CreateFunctionInfo).super_CreateInfo.catalog._M_string_length != 0) {
    KeywordHelper::WriteOptionallyQuoted
              (&local_b0,&(this->super_CreateFunctionInfo).super_CreateInfo.catalog,'\"',true);
    ::std::__cxx11::string::append((string *)&prefix);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::append((char *)&prefix);
  }
  if ((this->super_CreateFunctionInfo).super_CreateInfo.schema._M_string_length != 0) {
    KeywordHelper::WriteOptionallyQuoted
              (&local_b0,&(this->super_CreateFunctionInfo).super_CreateInfo.schema,'\"',true);
    ::std::__cxx11::string::append((string *)&prefix);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::append((char *)&prefix);
  }
  KeywordHelper::WriteOptionallyQuoted(&local_b0,&(this->super_CreateFunctionInfo).name,'\"',true);
  ::std::__cxx11::string::append((string *)&prefix);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::operator+(&local_70,&prefix," ");
  ::std::operator+(&local_50,&local_70,__return_storage_ptr__);
  ::std::operator+(&local_b0,&local_50,";");
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&prefix);
  return __return_storage_ptr__;
}

Assistant:

string CreateMacroInfo::ToString() const {
	string result;
	for (auto &function : macros) {
		if (!result.empty()) {
			result += ", ";
		}
		result += function->ToSQL();
	}
	// prefix with CREATE MACRO
	string prefix = "CREATE MACRO ";
	if (!catalog.empty()) {
		prefix += KeywordHelper::WriteOptionallyQuoted(catalog);
		prefix += ".";
	}
	if (!schema.empty()) {
		prefix += KeywordHelper::WriteOptionallyQuoted(schema);
		prefix += ".";
	}
	prefix += KeywordHelper::WriteOptionallyQuoted(name);
	result = prefix + " " + result + ";";
	return result;
}